

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::ParamUtils::localizeCallsTo::LocalizerPass::create(LocalizerPass *this)

{
  LocalizerPass *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::ParamUtils::localizeCallsTo(std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>const&,wasm::Module&,wasm::PassRunner*)::LocalizerPass,std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>const&>
            ((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
              *)&stack0xffffffffffffffe0);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::ParamUtils::localizeCallsTo(std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>const&,wasm::Module&,wasm::PassRunner*)::LocalizerPass,std::default_delete<wasm::ParamUtils::localizeCallsTo(std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>const&,wasm::Module&,wasm::PassRunner*)::LocalizerPass>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<LocalizerPass,_std::default_delete<LocalizerPass>_> *)
             &stack0xffffffffffffffe0);
  std::unique_ptr<LocalizerPass,_std::default_delete<LocalizerPass>_>::~unique_ptr
            ((unique_ptr<LocalizerPass,_std::default_delete<LocalizerPass>_> *)
             &stack0xffffffffffffffe0);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
      return std::make_unique<LocalizerPass>(callTargets);
    }